

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Announcements.cpp
# Opt level: O0

bool __thiscall RenX_AnnouncementsPlugin::initialize(RenX_AnnouncementsPlugin *this)

{
  bool bVar1;
  long lVar2;
  Timer *pTVar3;
  basic_string_view<char,_std::char_traits<char>_> in_key;
  longlong local_a0;
  duration<long,std::ratio<1l,1l>> local_98 [8];
  undefined8 local_90;
  milliseconds delay;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string_view local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  RenX_AnnouncementsPlugin *local_18;
  RenX_AnnouncementsPlugin *this_local;
  
  local_18 = this;
  local_28 = sv("Random",6);
  bVar1 = Jupiter::Config::get<bool>((Config *)&this->field_0x38,local_28,false);
  this->random = bVar1;
  local_58 = sv("File",4);
  s_abi_cxx11_(&local_78,"Announcements.txt",0x11);
  Jupiter::Config::get<std::__cxx11::string>
            (&local_48,(Config *)&this->field_0x38,local_58,&local_78);
  Jupiter::File::load(&this->announcementsFile,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_78);
  lVar2 = Jupiter::File::getLineCount();
  if (lVar2 == 0) {
    fputs("[RenX.Announcements] ERROR: No announcements loaded.\r\n",_stderr);
    this_local._7_1_ = false;
  }
  else {
    in_key = sv("Delay",5);
    local_a0 = Jupiter::Config::get<long_long>((Config *)&this->field_0x38,in_key,0x3c);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<long_long,void>(local_98,&local_a0);
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_90,
               (duration<long,_std::ratio<1L,_1L>_> *)local_98);
    pTVar3 = (Timer *)operator_new(0x30);
    Jupiter::Timer::Timer(pTVar3,0,local_90,announce_);
    this->timer = pTVar3;
    if ((this->random & 1U) == 0) {
      lVar2 = Jupiter::File::getLineCount();
      this->lastLine = lVar2 - 1;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RenX_AnnouncementsPlugin::initialize()
{
	RenX_AnnouncementsPlugin::random = this->config.get<bool>("Random"sv);

	RenX_AnnouncementsPlugin::announcementsFile.load(this->config.get("File"sv, "Announcements.txt"s));
	if (RenX_AnnouncementsPlugin::announcementsFile.getLineCount() == 0)
	{
		fputs("[RenX.Announcements] ERROR: No announcements loaded." ENDL, stderr);
		return false;
	}
	std::chrono::milliseconds delay = std::chrono::seconds(this->config.get<long long>("Delay"sv, 60));
	RenX_AnnouncementsPlugin::timer = new Jupiter::Timer(0, delay, announce_);
	if (RenX_AnnouncementsPlugin::random == false)
		RenX_AnnouncementsPlugin::lastLine = RenX_AnnouncementsPlugin::announcementsFile.getLineCount() - 1;
	return true;
}